

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_rectangle_gradient(rf_rec rec,rf_color col1,rf_color col2,rf_color col3,rf_color col4)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  rf_render_batch *prVar16;
  long lVar17;
  rf_vertex_buffer *prVar18;
  rf_context *prVar19;
  uint id;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float local_78;
  float fStack_74;
  float local_58;
  float fStack_54;
  
  prVar19 = rf__ctx;
  id = (rf__ctx->field_0).tex_shapes.id;
  if (id == 0) {
    id = (rf__ctx->field_0).default_texture_id;
    (rf__ctx->field_0).tex_shapes.id = id;
    (prVar19->field_0).tex_shapes.width = 1;
    (prVar19->field_0).tex_shapes.height = 1;
    (prVar19->field_0).tex_shapes.mipmaps = 1;
    (prVar19->field_0).tex_shapes.format = RF_UNCOMPRESSED_R8G8B8A8;
    *(undefined4 *)&(prVar19->field_0).tex_shapes.valid = 0;
    (prVar19->field_0).rec_tex_shapes.x = 0.0;
    (prVar19->field_0).rec_tex_shapes.y = 0.0;
    (prVar19->field_0).rec_tex_shapes.width = 1.0;
    (prVar19->field_0).rec_tex_shapes.height = 1.0;
  }
  rf_gfx_enable_texture(id);
  rf_gfx_push_matrix();
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(col1.r,col1.g,col1.b,col1.a);
  prVar16 = (rf__ctx->field_0).current_batch;
  lVar17 = prVar16->current_buffer;
  prVar18 = prVar16->vertex_buffers;
  iVar15 = prVar18[lVar17].tc_counter;
  uVar1 = (rf__ctx->field_0).rec_tex_shapes.x;
  uVar8 = (rf__ctx->field_0).rec_tex_shapes.y;
  auVar20._4_4_ = uVar8;
  auVar20._0_4_ = uVar1;
  auVar20._8_8_ = 0;
  uVar2 = (rf__ctx->field_0).tex_shapes.width;
  uVar9 = (rf__ctx->field_0).tex_shapes.height;
  auVar23._0_4_ = (float)(int)uVar2;
  auVar23._4_4_ = (float)(int)uVar9;
  auVar23._8_8_ = 0;
  auVar20 = divps(auVar20,auVar23);
  *(long *)(prVar18[lVar17].texcoords + (long)iVar15 * 2) = auVar20._0_8_;
  prVar18[lVar17].tc_counter = iVar15 + 1;
  local_58 = rec.x;
  fStack_54 = rec.y;
  rf_gfx_vertex3f(local_58,fStack_54,prVar16->current_depth);
  rf_gfx_color4ub(col2.r,col2.g,col2.b,col2.a);
  prVar16 = (rf__ctx->field_0).current_batch;
  lVar17 = prVar16->current_buffer;
  prVar18 = prVar16->vertex_buffers;
  iVar15 = prVar18[lVar17].tc_counter;
  uVar3 = (rf__ctx->field_0).tex_shapes.width;
  uVar10 = (rf__ctx->field_0).tex_shapes.height;
  auVar24._0_4_ = (float)(int)uVar3;
  auVar24._4_4_ = (float)(int)uVar10;
  auVar24._8_8_ = 0;
  auVar27._4_4_ = (rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height;
  auVar27._0_4_ = (rf__ctx->field_0).rec_tex_shapes.x;
  auVar27._8_8_ = 0;
  auVar20 = divps(auVar27,auVar24);
  *(long *)(prVar18[lVar17].texcoords + (long)iVar15 * 2) = auVar20._0_8_;
  prVar18[lVar17].tc_counter = iVar15 + 1;
  local_78 = rec.width;
  fStack_74 = rec.height;
  rf_gfx_vertex3f(local_58,fStack_74 + fStack_54,prVar16->current_depth);
  rf_gfx_color4ub(col3.r,col3.g,col3.b,col3.a);
  prVar16 = (rf__ctx->field_0).current_batch;
  lVar17 = prVar16->current_buffer;
  prVar18 = prVar16->vertex_buffers;
  iVar15 = prVar18[lVar17].tc_counter;
  uVar4 = (rf__ctx->field_0).rec_tex_shapes.x;
  uVar11 = (rf__ctx->field_0).rec_tex_shapes.y;
  uVar5 = (rf__ctx->field_0).rec_tex_shapes.width;
  uVar12 = (rf__ctx->field_0).rec_tex_shapes.height;
  auVar25._0_4_ = (float)uVar5 + (float)uVar4;
  auVar25._4_4_ = (float)uVar12 + (float)uVar11;
  auVar25._8_8_ = 0;
  uVar6 = (rf__ctx->field_0).tex_shapes.width;
  uVar13 = (rf__ctx->field_0).tex_shapes.height;
  auVar21._0_4_ = (float)(int)uVar6;
  auVar21._4_4_ = (float)(int)uVar13;
  auVar21._8_8_ = 0;
  auVar20 = divps(auVar25,auVar21);
  *(long *)(prVar18[lVar17].texcoords + (long)iVar15 * 2) = auVar20._0_8_;
  prVar18[lVar17].tc_counter = iVar15 + 1;
  rf_gfx_vertex3f(local_78 + local_58,fStack_74 + fStack_54,prVar16->current_depth);
  rf_gfx_color4ub(col4.r,col4.g,col4.b,col4.a);
  auVar22._0_4_ = (rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width;
  prVar16 = (rf__ctx->field_0).current_batch;
  lVar17 = prVar16->current_buffer;
  prVar18 = prVar16->vertex_buffers;
  iVar15 = prVar18[lVar17].tc_counter;
  uVar7 = (rf__ctx->field_0).tex_shapes.width;
  uVar14 = (rf__ctx->field_0).tex_shapes.height;
  auVar26._0_4_ = (float)(int)uVar7;
  auVar26._4_4_ = (float)(int)uVar14;
  auVar26._8_8_ = 0;
  auVar22._4_4_ = (rf__ctx->field_0).rec_tex_shapes.y;
  auVar22._8_8_ = 0;
  auVar20 = divps(auVar22,auVar26);
  *(long *)(prVar18[lVar17].texcoords + (long)iVar15 * 2) = auVar20._0_8_;
  prVar18[lVar17].tc_counter = iVar15 + 1;
  rf_gfx_vertex3f(local_78 + local_58,fStack_54,prVar16->current_depth);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_rectangle_gradient(rf_rec rec, rf_color col1, rf_color col2, rf_color col3, rf_color col4)
{
    rf_gfx_enable_texture(rf_get_shapes_texture().id);

    rf_gfx_push_matrix();
    rf_gfx_begin(RF_QUADS);
    rf_gfx_normal3f(0.0f, 0.0f, 1.0f);

    // NOTE: Default raylib font character 95 is a white square
    rf_gfx_color4ub(col1.r, col1.g, col1.b, col1.a);
    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x, rec.y);

    rf_gfx_color4ub(col2.r, col2.g, col2.b, col2.a);
    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x, rec.y + rec.height);

    rf_gfx_color4ub(col3.r, col3.g, col3.b, col3.a);
    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x + rec.width, rec.y + rec.height);

    rf_gfx_color4ub(col4.r, col4.g, col4.b, col4.a);
    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x + rec.width, rec.y);
    rf_gfx_end();
    rf_gfx_pop_matrix();

    rf_gfx_disable_texture();
}